

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_attr_set_v3i(exr_context_t ctxt,int part_index,char *name,exr_attr_v3i_t *val)

{
  exr_attr_box2i_t *peVar1;
  exr_result_t eVar2;
  int iVar3;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  local_30 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar2 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar2;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar5 = 0x15;
LAB_0011cba8:
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar5);
    return eVar2;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar5 = 8;
    goto LAB_0011cba8;
  }
  list = (exr_attribute_list_t *)
         (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
  eVar2 = exr_attr_list_find_by_name(ctxt,list,name,&local_30);
  if (eVar2 == 0) {
    iVar3 = 0;
    if (local_30->type != EXR_ATTR_V3I) {
      pcVar6 = local_30->type_name;
      pcVar4 = "\'%s\' requested type \'v3i\', but stored attributes is type \'%s\'";
      uVar5 = 0x10;
      goto LAB_0011cc70;
    }
  }
  else {
    if (eVar2 != 0xf) {
      return eVar2;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      return 0xf;
    }
    iVar3 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_V3I,0,(uint8_t **)0x0,&local_30);
  }
  if (val != (exr_attr_v3i_t *)0x0) {
    if (iVar3 != 0) {
      return iVar3;
    }
    peVar1 = (local_30->field_6).box2i;
    (peVar1->max).field_0.field_0.x = (val->field_0).field_0.z;
    (peVar1->min).field_0 = *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)&val->field_0;
    return 0;
  }
  pcVar4 = "No input value for setting \'%s\', type \'%s\'";
  pcVar6 = "v3i";
  uVar5 = 3;
LAB_0011cc70:
  eVar2 = (**(code **)(ctxt + 0x48))(ctxt,uVar5,pcVar4,name,pcVar6);
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_v3i (
    exr_context_t         ctxt,
    int                   part_index,
    const char*           name,
    const exr_attr_v3i_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_V3I, v3i);
}